

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::DisposeOutRec(Clipper *this,size_type index)

{
  OutRec *pOVar1;
  
  pOVar1 = (this->m_PolyOuts).
           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
           super__Vector_impl_data._M_start[index];
  if (pOVar1->pts != (OutPt *)0x0) {
    DisposeOutPts(&pOVar1->pts);
  }
  if (pOVar1 != (OutRec *)0x0) {
    operator_delete(pOVar1);
  }
  (this->m_PolyOuts).super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
  ._M_impl.super__Vector_impl_data._M_start[index] = (OutRec *)0x0;
  return;
}

Assistant:

void Clipper::DisposeOutRec(PolyOutList::size_type index)
{
  OutRec *outRec = m_PolyOuts[index];
  if (outRec->pts) DisposeOutPts(outRec->pts);
  delete outRec;
  m_PolyOuts[index] = 0;
}